

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbAbc.c
# Opt level: O0

Acb_Ntk_t *
Acb_NtkFromNdr(char *pFileName,void *pModule,Abc_Nam_t *pNames,Vec_Int_t *vWeights,int nNameIdMax)

{
  Acb_Man_t *p_00;
  int iVar1;
  int iVar2;
  int nCos;
  int nObjs;
  Abc_Nam_t *pStrs;
  Acb_Ntk_t *p_01;
  Vec_Int_t *p_02;
  int local_dc;
  int local_ac;
  Vec_Int_t *vMap;
  Acb_Ntk_t *pNtk;
  int *piStack_60;
  int ObjId;
  int *pArray;
  int nArray;
  int Type;
  int Obj;
  int Mod;
  int NameId;
  int k;
  Acb_Man_t *pMan;
  Ndr_Data_t *p;
  Vec_Int_t *pVStack_28;
  int nNameIdMax_local;
  Vec_Int_t *vWeights_local;
  Abc_Nam_t *pNames_local;
  void *pModule_local;
  char *pFileName_local;
  
  pMan = (Acb_Man_t *)pModule;
  p._4_4_ = nNameIdMax;
  pVStack_28 = vWeights;
  vWeights_local = (Vec_Int_t *)pNames;
  pNames_local = (Abc_Nam_t *)pModule;
  pModule_local = pFileName;
  pStrs = Abc_NamRef(pNames);
  _NameId = Acb_ManAlloc(pFileName,1,pStrs,(Abc_Nam_t *)0x0,(Abc_Nam_t *)0x0,(Hash_IntMan_t *)0x0);
  iVar1 = Abc_NamStrFindOrAdd(_NameId->pStrs,_NameId->pName,(int *)0x0);
  p_00 = _NameId;
  Type = 2;
  Obj = iVar1;
  iVar2 = Ndr_DataCiNum((Ndr_Data_t *)pMan,2);
  nCos = Ndr_DataCoNum((Ndr_Data_t *)pMan,Type);
  nObjs = Ndr_DataObjNum((Ndr_Data_t *)pMan,Type);
  p_01 = Acb_NtkAlloc(p_00,iVar1,iVar2,nCos,nObjs);
  p_02 = Vec_IntStart(p._4_4_);
  Acb_NtkCleanObjWeights(p_01);
  Acb_NtkCleanObjNames(p_01);
  for (nArray = Type + 1; iVar1 = nArray, iVar2 = Ndr_DataEnd((Ndr_Data_t *)pMan,Type),
      iVar1 < iVar2; nArray = iVar1 + nArray) {
    iVar1 = Ndr_DataType((Ndr_Data_t *)pMan,nArray);
    if ((iVar1 == 3) && (iVar1 = Ndr_ObjIsType((Ndr_Data_t *)pMan,nArray,3), iVar1 != 0)) {
      Obj = Ndr_ObjReadBody((Ndr_Data_t *)pMan,nArray,5);
      iVar1 = Acb_ObjAlloc(p_01,ABC_OPER_CI,0,0);
      Vec_IntWriteEntry(p_02,Obj,iVar1);
      Acb_ObjSetName(p_01,iVar1,Obj);
      if (pVStack_28 == (Vec_Int_t *)0x0) {
        local_ac = 1;
      }
      else {
        local_ac = Vec_IntEntry(pVStack_28,Obj);
      }
      Acb_ObjSetWeight(p_01,iVar1,local_ac);
    }
    iVar1 = Ndr_DataSize((Ndr_Data_t *)pMan,nArray);
  }
  for (nArray = Type + 1; iVar1 = nArray, iVar2 = Ndr_DataEnd((Ndr_Data_t *)pMan,Type),
      iVar1 < iVar2; nArray = iVar1 + nArray) {
    iVar1 = Ndr_DataType((Ndr_Data_t *)pMan,nArray);
    if (iVar1 == 10) {
      Obj = Ndr_DataEntry((Ndr_Data_t *)pMan,nArray);
      iVar1 = Acb_ObjAlloc(p_01,ABC_OPER_CONST_F,0,0);
      Vec_IntWriteEntry(p_02,Obj,iVar1);
      Acb_ObjSetName(p_01,iVar1,Obj);
      Vec_IntPush(&p_01->vTargets,iVar1);
    }
    iVar1 = Ndr_DataSize((Ndr_Data_t *)pMan,nArray);
  }
  for (nArray = Type + 1; iVar1 = nArray, iVar2 = Ndr_DataEnd((Ndr_Data_t *)pMan,Type),
      iVar1 < iVar2; nArray = iVar1 + nArray) {
    iVar1 = Ndr_DataType((Ndr_Data_t *)pMan,nArray);
    if (((iVar1 == 3) && (iVar1 = Ndr_ObjIsType((Ndr_Data_t *)pMan,nArray,3), iVar1 == 0)) &&
       (iVar1 = Ndr_ObjIsType((Ndr_Data_t *)pMan,nArray,4), iVar1 == 0)) {
      Obj = Ndr_ObjReadBody((Ndr_Data_t *)pMan,nArray,5);
      pArray._0_4_ = Ndr_ObjReadArray((Ndr_Data_t *)pMan,nArray,4,&stack0xffffffffffffffa0);
      pArray._4_4_ = Ndr_ObjReadBody((Ndr_Data_t *)pMan,nArray,6);
      iVar1 = Acb_ObjAlloc(p_01,pArray._4_4_,(int)pArray,0);
      Vec_IntWriteEntry(p_02,Obj,iVar1);
      Acb_ObjSetName(p_01,iVar1,Obj);
    }
    iVar1 = Ndr_DataSize((Ndr_Data_t *)pMan,nArray);
  }
  for (nArray = Type + 1; iVar1 = nArray, iVar2 = Ndr_DataEnd((Ndr_Data_t *)pMan,Type),
      iVar1 < iVar2; nArray = iVar1 + nArray) {
    iVar1 = Ndr_DataType((Ndr_Data_t *)pMan,nArray);
    if (((iVar1 == 3) && (iVar1 = Ndr_ObjIsType((Ndr_Data_t *)pMan,nArray,3), iVar1 == 0)) &&
       (iVar1 = Ndr_ObjIsType((Ndr_Data_t *)pMan,nArray,4), iVar1 == 0)) {
      Obj = Ndr_ObjReadBody((Ndr_Data_t *)pMan,nArray,5);
      iVar1 = Vec_IntEntry(p_02,Obj);
      pArray._0_4_ = Ndr_ObjReadArray((Ndr_Data_t *)pMan,nArray,4,&stack0xffffffffffffffa0);
      for (Mod = 0; Mod < (int)pArray; Mod = Mod + 1) {
        iVar2 = Vec_IntEntry(p_02,piStack_60[Mod]);
        Acb_ObjAddFanin(p_01,iVar1,iVar2);
      }
      if (pVStack_28 == (Vec_Int_t *)0x0) {
        local_dc = 1;
      }
      else {
        local_dc = Vec_IntEntry(pVStack_28,Obj);
      }
      Acb_ObjSetWeight(p_01,iVar1,local_dc);
    }
    iVar1 = Ndr_DataSize((Ndr_Data_t *)pMan,nArray);
  }
  nArray = Type + 1;
  do {
    iVar1 = nArray;
    iVar2 = Ndr_DataEnd((Ndr_Data_t *)pMan,Type);
    if (iVar2 <= iVar1) {
      Vec_IntFree(p_02);
      Acb_NtkSetRegNum(p_01,0);
      Acb_NtkAdd(_NameId,p_01);
      return p_01;
    }
    iVar1 = Ndr_DataType((Ndr_Data_t *)pMan,nArray);
    if ((iVar1 == 3) && (iVar1 = Ndr_ObjIsType((Ndr_Data_t *)pMan,nArray,4), iVar1 != 0)) {
      pArray._0_4_ = Ndr_ObjReadArray((Ndr_Data_t *)pMan,nArray,4,&stack0xffffffffffffffa0);
      if ((int)pArray != 1) {
        __assert_fail("nArray == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbAbc.c"
                      ,0xd5,
                      "Acb_Ntk_t *Acb_NtkFromNdr(char *, void *, Abc_Nam_t *, Vec_Int_t *, int)");
      }
      iVar1 = Acb_ObjAlloc(p_01,ABC_OPER_CO,1,0);
      iVar2 = Vec_IntEntry(p_02,*piStack_60);
      Acb_ObjAddFanin(p_01,iVar1,iVar2);
      Acb_ObjSetName(p_01,iVar1,*piStack_60);
    }
    iVar1 = Ndr_DataSize((Ndr_Data_t *)pMan,nArray);
    nArray = iVar1 + nArray;
  } while( true );
}

Assistant:

Acb_Ntk_t * Acb_NtkFromNdr( char * pFileName, void * pModule, Abc_Nam_t * pNames, Vec_Int_t * vWeights, int nNameIdMax )
{
    Ndr_Data_t * p   = (Ndr_Data_t *)pModule; 
    Acb_Man_t * pMan = Acb_ManAlloc( pFileName, 1, Abc_NamRef(pNames), NULL, NULL, NULL );
    int k, NameId = Abc_NamStrFindOrAdd( pMan->pStrs, pMan->pName, NULL );
    int Mod = 2, Obj, Type, nArray, * pArray, ObjId;
    Acb_Ntk_t * pNtk = Acb_NtkAlloc( pMan, NameId, Ndr_DataCiNum(p, Mod), Ndr_DataCoNum(p, Mod), Ndr_DataObjNum(p, Mod) );
    Vec_Int_t * vMap = Vec_IntStart( nNameIdMax );
    Acb_NtkCleanObjWeights( pNtk );
    Acb_NtkCleanObjNames( pNtk );
    Ndr_ModForEachPi( p, Mod, Obj )
    {
        NameId = Ndr_ObjReadBody( p, Obj, NDR_OUTPUT );
        ObjId  = Acb_ObjAlloc( pNtk, ABC_OPER_CI, 0, 0 );
        Vec_IntWriteEntry( vMap, NameId, ObjId );
        Acb_ObjSetName( pNtk, ObjId, NameId );
        Acb_ObjSetWeight( pNtk, ObjId, vWeights ? Vec_IntEntry(vWeights, NameId) : 1 );
    }
    Ndr_ModForEachTarget( p, Mod, Obj )
    {
        NameId = Ndr_DataEntry( p, Obj );
        ObjId  = Acb_ObjAlloc( pNtk, ABC_OPER_CONST_F, 0, 0 );
        Vec_IntWriteEntry( vMap, NameId, ObjId );
        Acb_ObjSetName( pNtk, ObjId, NameId );
        Vec_IntPush( &pNtk->vTargets, ObjId );
    }
    Ndr_ModForEachNode( p, Mod, Obj )
    {
        NameId = Ndr_ObjReadBody( p, Obj, NDR_OUTPUT );
        nArray = Ndr_ObjReadArray( p, Obj, NDR_INPUT, &pArray );
        Type   = Ndr_ObjReadBody( p, Obj, NDR_OPERTYPE );
        ObjId  = Acb_ObjAlloc( pNtk, (Acb_ObjType_t) Type, nArray, 0 );
        Vec_IntWriteEntry( vMap, NameId, ObjId );
        Acb_ObjSetName( pNtk, ObjId, NameId );
    }
    Ndr_ModForEachNode( p, Mod, Obj )
    {
        //char * pName;
        NameId = Ndr_ObjReadBody( p, Obj, NDR_OUTPUT );
        //pName = Abc_NamStr( pMan->pStrs, NameId );
        ObjId  = Vec_IntEntry( vMap, NameId );
        nArray = Ndr_ObjReadArray( p, Obj, NDR_INPUT, &pArray );
        for ( k = 0; k < nArray; k++ )
            Acb_ObjAddFanin( pNtk, ObjId, Vec_IntEntry(vMap, pArray[k]) );
        Acb_ObjSetWeight( pNtk, ObjId, vWeights ? Vec_IntEntry(vWeights, NameId) : 1 );
    }
    Ndr_ModForEachPo( p, Mod, Obj )
    {
        nArray = Ndr_ObjReadArray( p, Obj, NDR_INPUT, &pArray );
        assert( nArray == 1 );
        ObjId  = Acb_ObjAlloc( pNtk, ABC_OPER_CO, 1, 0 );
        Acb_ObjAddFanin( pNtk, ObjId, Vec_IntEntry(vMap, pArray[0]) );
        Acb_ObjSetName( pNtk, ObjId, pArray[0] );
    }
    Vec_IntFree( vMap );
    Acb_NtkSetRegNum( pNtk, 0 );
    Acb_NtkAdd( pMan, pNtk );
    return pNtk;
}